

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall google::protobuf::io::CordInputStream::NextChunk(CordInputStream *this,size_t skip)

{
  size_t distance;
  size_t skip_local;
  CordInputStream *this_local;
  
  if (this->size_ == 0) {
    this_local._7_1_ = false;
  }
  else {
    absl::lts_20240722::Cord::Advance(&this->it_,(this->size_ - this->available_) + skip);
    this->bytes_remaining_ = this->bytes_remaining_ - skip;
    this_local._7_1_ = LoadChunkData(this);
  }
  return this_local._7_1_;
}

Assistant:

bool CordInputStream::NextChunk(size_t skip) {
  // `size_ == 0` indicates we're at EOF.
  if (size_ == 0) return false;

  // The caller consumed 'size_ - available_' bytes that are not yet accounted
  // for in the iterator position to get to the start of the next chunk.
  const size_t distance = size_ - available_ + skip;
  absl::Cord::Advance(&it_, distance);
  bytes_remaining_ -= skip;

  return LoadChunkData();
}